

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pthread.cc
# Opt level: O1

int CRYPTO_set_thread_local
              (thread_local_data_t index,void *value,thread_local_destructor_t destructor)

{
  int iVar1;
  undefined8 *__pointer;
  
  iVar1 = pthread_once(&g_thread_local_init_once,thread_local_init);
  if (iVar1 != 0) {
    abort();
  }
  if (g_thread_local_key_created == 0) goto LAB_00169e2a;
  __pointer = (undefined8 *)pthread_getspecific(g_thread_local_key);
  if (__pointer == (undefined8 *)0x0) {
    __pointer = (undefined8 *)malloc(0x28);
    if (__pointer == (undefined8 *)0x0) goto LAB_00169e2a;
    __pointer[2] = 0;
    __pointer[3] = 0;
    *__pointer = 0;
    __pointer[1] = 0;
    __pointer[4] = 0;
    iVar1 = pthread_setspecific(g_thread_local_key,__pointer);
    if (iVar1 != 0) {
      free(__pointer);
      goto LAB_00169e2a;
    }
  }
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&g_destructors_lock);
  if (iVar1 == 0) {
    g_destructors[index] = destructor;
    pthread_mutex_unlock((pthread_mutex_t *)&g_destructors_lock);
    __pointer[index] = value;
    return 1;
  }
LAB_00169e2a:
  (*destructor)(value);
  return 0;
}

Assistant:

int CRYPTO_set_thread_local(thread_local_data_t index, void *value,
                            thread_local_destructor_t destructor) {
  CRYPTO_once(&g_thread_local_init_once, thread_local_init);
  if (!g_thread_local_key_created) {
    destructor(value);
    return 0;
  }

  void **pointers =
      reinterpret_cast<void **>(pthread_getspecific(g_thread_local_key));
  if (pointers == NULL) {
    pointers = reinterpret_cast<void **>(
        malloc(sizeof(void *) * NUM_OPENSSL_THREAD_LOCALS));
    if (pointers == NULL) {
      destructor(value);
      return 0;
    }
    OPENSSL_memset(pointers, 0, sizeof(void *) * NUM_OPENSSL_THREAD_LOCALS);
    if (pthread_setspecific(g_thread_local_key, pointers) != 0) {
      free(pointers);
      destructor(value);
      return 0;
    }
  }

  if (pthread_mutex_lock(&g_destructors_lock) != 0) {
    destructor(value);
    return 0;
  }
  g_destructors[index] = destructor;
  pthread_mutex_unlock(&g_destructors_lock);

  pointers[index] = value;
  return 1;
}